

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.cpp
# Opt level: O1

void __thiscall
TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT<double>(TPZMultiphysicsElement *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  ulong uVar7;
  TPZCompMesh *pTVar8;
  TPZCompEl *this_00;
  long lVar9;
  long lVar10;
  TPZFMatrix<double> *pTVar11;
  TPZFMatrix<double> *pTVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  long local_90;
  int local_48;
  
  uVar7 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x270))();
  pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
  if (0 < (int)uVar7) {
    uVar4 = ((pTVar8->fSolution).fBaseMatrix)->fCol;
    uVar15 = 0;
    iVar13 = 0;
    do {
      this_00 = (TPZCompEl *)(**(code **)(*(long *)&this->super_TPZCompEl + 0x268))(this,uVar15);
      if (this_00 != (TPZCompEl *)0x0) {
        cVar5 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x2f8))(this,uVar15 & 0xffffffff);
        if (cVar5 != '\0') {
          iVar6 = (**(code **)(*(long *)this_00 + 0x90))();
          if (0 < iVar6) {
            iVar16 = 0;
            do {
              lVar9 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa8))(this,iVar13);
              lVar10 = (**(code **)(*(long *)this_00 + 0xa8))(this_00,iVar16);
              iVar2 = *(int *)(lVar9 + 8);
              iVar3 = *(int *)(lVar10 + 8);
              pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
              lVar9 = (long)(pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar2].dim;
              pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
              iVar2 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar2].pos;
              pTVar8 = TPZCompEl::Mesh(this_00);
              iVar3 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar3].pos;
              pTVar8 = TPZCompEl::Mesh(this_00);
              pTVar11 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fSolution);
              pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
              pTVar12 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar8->fSolution);
              if (0 < lVar9) {
                local_90 = 0;
                do {
                  local_48 = (int)uVar4;
                  if (0 < local_48) {
                    lVar10 = local_90 + iVar2;
                    lVar1 = local_90 + iVar3;
                    uVar14 = 0;
                    do {
                      if (((lVar10 < 0) ||
                          ((pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar10))
                         || ((pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
                             (long)uVar14)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      if (((lVar1 < 0) ||
                          ((pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar1)) ||
                         ((pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <=
                          (long)uVar14)) {
                        TPZFMatrix<double>::Error
                                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                        pzinternal::DebugStopImpl
                                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                                   ,0x26d);
                      }
                      pTVar11->fElem
                      [(pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar14 + lVar1]
                           = pTVar12->fElem
                             [(pTVar12->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar14 +
                              lVar10];
                      uVar14 = uVar14 + 1;
                    } while ((uVar4 & 0x7fffffff) != uVar14);
                  }
                  local_90 = local_90 + 1;
                } while (local_90 != lVar9);
              }
              iVar16 = iVar16 + 1;
              iVar13 = iVar13 + 1;
            } while (iVar16 != iVar6);
          }
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != (uVar7 & 0x7fffffff));
  }
  return;
}

Assistant:

void TPZMultiphysicsElement::TransferMultiphysicsElementSolutionT()
{
    int nmeshes = this->NMeshes();
    int icon = 0;
    int nload = this->Mesh()->Solution().Cols();
    for (int imesh = 0; imesh < nmeshes; imesh++) {
        TPZCompEl *cel = this->ReferredElement(imesh);
        if (!cel) {
            continue;
        }
        if(!this->IsActiveApproxSpaces(imesh)){
            continue;
        }
        int ncon = cel->NConnects();
        for (int iconloc = 0; iconloc < ncon; iconloc++, icon++) {
            TPZConnect &con = this->Connect(icon);
            TPZConnect &conloc = cel->Connect(iconloc);
            int64_t seq = con.SequenceNumber();
            int64_t seqloc = conloc.SequenceNumber();
            int blsz = this->Mesh()->Block().Size(seq);

#ifdef PZDEBUG
            int blszloc = cel->Mesh()->Block().Size(seqloc);
            if (blsz != blszloc) {
                DebugStop();
            }
#endif
            int pos = this->Mesh()->Block().Position(seq);
            int posloc = cel->Mesh()->Block().Position(seqloc);
            TPZFMatrix<TVar> &celSol = cel->Mesh()->Solution();
            TPZFMatrix<TVar> &meshSol = this->Mesh()->Solution();
            for (int ibl = 0; ibl < blsz; ibl++) {
                for (int iload = 0; iload < nload; iload++) {
                    celSol(posloc+ibl,iload) = meshSol(pos+ibl,iload);
                }

            }
        }
    }
}